

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

uint32 * rw::ps2::instanceXYZ(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  ulong uVar3;
  uint32 *puVar4;
  
  pVVar2 = g->morphTargets->vertices;
  puVar4 = p;
  for (uVar3 = (ulong)idx; uVar3 < n + idx; uVar3 = uVar3 + 1) {
    uVar1 = m->indices[uVar3];
    *p = (uint32)pVVar2[uVar1].x;
    ((float32 *)p)[1] = pVVar2[uVar1].y;
    ((float32 *)p)[2] = pVVar2[uVar1].z;
    p = (uint32 *)((float32 *)p + 3);
    puVar4 = puVar4 + 3;
  }
  for (; ((ulong)puVar4 & 0xf) != 0; puVar4 = puVar4 + 1) {
    *p = 0;
    p = (uint32 *)((float32 *)p + 1);
  }
  return p;
}

Assistant:

uint32*
instanceXYZ(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->morphTargets[0].vertices;
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		*p++ = d[j*3+0];
		*p++ = d[j*3+1];
		*p++ = d[j*3+2];
	}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}